

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

bool __thiscall
google::protobuf::EnumOptions::MergePartialFromCodedStream
          (EnumOptions *this,CodedInputStream *input)

{
  uint8 uVar1;
  int iVar2;
  void **ppvVar3;
  bool bVar4;
  uint uVar5;
  Limit limit;
  uint8 *puVar6;
  UninterpretedOption *this_00;
  uint8 *puVar7;
  uint32 uVar8;
  int iVar9;
  uint32 local_48;
  uint32 local_44;
  RepeatedPtrFieldBase *local_40;
  ExtensionSet *local_38;
  
  local_40 = &(this->uninterpreted_option_).super_RepeatedPtrFieldBase;
  local_38 = &this->_extensions_;
  do {
    while( true ) {
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (uVar8 = (uint32)(char)*puVar7, -1 < (char)*puVar7)) {
        input->last_tag_ = uVar8;
        input->buffer_ = puVar7 + 1;
      }
      else {
        uVar8 = io::CodedInputStream::ReadTagFallback(input);
        input->last_tag_ = uVar8;
      }
      if (uVar8 == 0) {
        return true;
      }
      uVar5 = uVar8 & 7;
      if (uVar8 >> 3 == 999) break;
      if ((uVar8 >> 3 != 2) || (uVar5 != 0)) goto LAB_001ef9ec;
      puVar6 = input->buffer_;
      puVar7 = input->buffer_end_;
      if ((puVar6 < puVar7) && (uVar1 = *puVar6, -1 < (char)uVar1)) {
        puVar6 = puVar6 + 1;
        input->buffer_ = puVar6;
        uVar8 = (int)(char)uVar1;
      }
      else {
        bVar4 = io::CodedInputStream::ReadVarint32Fallback(input,&local_44);
        if (!bVar4) {
          return false;
        }
        puVar6 = input->buffer_;
        puVar7 = input->buffer_end_;
        uVar8 = local_44;
      }
      this->allow_alias_ = uVar8 != 0;
      *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 1;
      if (((1 < (int)puVar7 - (int)puVar6) && (*puVar6 == 0xba)) && (puVar6[1] == '>')) {
        do {
          input->buffer_ = puVar6 + 2;
LAB_001efa7e:
          iVar2 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
          iVar9 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.allocated_size_;
          if (iVar2 < iVar9) {
            ppvVar3 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.elements_;
            (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
            this_00 = (UninterpretedOption *)ppvVar3[iVar2];
          }
          else {
            if (iVar9 == (this->uninterpreted_option_).super_RepeatedPtrFieldBase.total_size_) {
              internal::RepeatedPtrFieldBase::Reserve(local_40,iVar9 + 1);
              iVar9 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.allocated_size_;
            }
            (this->uninterpreted_option_).super_RepeatedPtrFieldBase.allocated_size_ = iVar9 + 1;
            this_00 = internal::GenericTypeHandler<google::protobuf::UninterpretedOption>::New();
            ppvVar3 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.elements_;
            iVar2 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
            (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
            ppvVar3[iVar2] = this_00;
          }
          puVar7 = input->buffer_;
          if ((puVar7 < input->buffer_end_) && (uVar1 = *puVar7, -1 < (char)uVar1)) {
            input->buffer_ = puVar7 + 1;
            local_48 = (int)(char)uVar1;
          }
          else {
            bVar4 = io::CodedInputStream::ReadVarint32Fallback(input,&local_48);
            if (!bVar4) {
              return false;
            }
          }
          iVar2 = input->recursion_depth_;
          input->recursion_depth_ = iVar2 + 1;
          if (input->recursion_limit_ <= iVar2) {
            return false;
          }
          limit = io::CodedInputStream::PushLimit(input,local_48);
          bVar4 = UninterpretedOption::MergePartialFromCodedStream(this_00,input);
          if (!bVar4) {
            return false;
          }
          if (input->legitimate_message_end_ != true) {
            return false;
          }
          io::CodedInputStream::PopLimit(input,limit);
          if (0 < input->recursion_depth_) {
            input->recursion_depth_ = input->recursion_depth_ + -1;
          }
          puVar6 = input->buffer_;
        } while (((1 < (int)input->buffer_end_ - (int)puVar6) && (*puVar6 == 0xba)) &&
                (puVar6[1] == '>'));
        if ((puVar6 == input->buffer_end_) &&
           ((input->buffer_size_after_limit_ != 0 ||
            (input->total_bytes_read_ == input->current_limit_)))) {
          input->last_tag_ = 0;
          input->legitimate_message_end_ = true;
          return true;
        }
      }
    }
    if (uVar5 == 2) goto LAB_001efa7e;
LAB_001ef9ec:
    if (uVar5 == 4) {
      return true;
    }
    if (uVar8 < 8000) {
      bVar4 = internal::WireFormat::SkipField(input,uVar8,&this->_unknown_fields_);
    }
    else {
      bVar4 = internal::ExtensionSet::ParseField
                        (local_38,uVar8,input,default_instance_,&this->_unknown_fields_);
    }
    if (bVar4 == false) {
      return false;
    }
  } while( true );
}

Assistant:

bool EnumOptions::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!(EXPRESSION)) return false
  ::google::protobuf::uint32 tag;
  while ((tag = input->ReadTag()) != 0) {
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional bool allow_alias = 2 [default = true];
      case 2: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_VARINT) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &allow_alias_)));
          set_has_allow_alias();
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(7994)) goto parse_uninterpreted_option;
        break;
      }

      // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
      case 999: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_uninterpreted_option:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_uninterpreted_option()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(7994)) goto parse_uninterpreted_option;
        if (input->ExpectAtEnd()) return true;
        break;
      }

      default: {
      handle_uninterpreted:
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          return true;
        }
        if ((8000u <= tag)) {
          DO_(_extensions_.ParseField(tag, input, default_instance_,
                                      mutable_unknown_fields()));
          continue;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
  return true;
#undef DO_
}